

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall cnn::AdamTrainer::update(AdamTrainer *this,real scale)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  real rVar6;
  uint uVar7;
  pointer pSVar8;
  Parameters *this_00;
  pointer pSVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  pointer pTVar16;
  pointer pTVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  pointer pSVar21;
  uint uVar22;
  Index size;
  Model *pMVar23;
  int iVar24;
  pointer pSVar25;
  _Hash_node_base *p_Var26;
  char *__function;
  int iVar27;
  Index index_3;
  int iVar28;
  uint uVar29;
  Index index_1;
  ulong uVar30;
  ulong uVar31;
  LookupParameters *this_01;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  Index index_6;
  ulong uVar37;
  int iVar38;
  uint uVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar56;
  float fVar57;
  undefined1 auVar54 [16];
  float fVar53;
  float fVar58;
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar64;
  float fVar65;
  undefined1 in_XMM13 [16];
  undefined1 auVar62 [16];
  float fVar66;
  undefined1 auVar63 [16];
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_f8;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_d8;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  LookupParameters *local_a0;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  ulong local_88;
  pointer local_80;
  pointer local_78;
  _Hash_node_base *local_70;
  undefined1 local_68 [16];
  float local_58;
  float *pfStack_4c;
  long *local_40;
  long *local_38;
  
  local_a0 = (LookupParameters *)CONCAT44(local_a0._4_4_,scale);
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_f8,
               (this->super_Trainer).model);
    pSVar8 = (this->m).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->m).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pSVar9 = (this->m).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_f8.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar9,0);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar9 >> 0x20);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar8,0);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar8 >> 0x20);
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_d8);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_f8);
    AllocateShadowLookupParameters(&local_f8,(this->super_Trainer).model);
    pSVar25 = (this->lm).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->lm).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar21 = (this->lm).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_f8.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar21,0);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar21 >> 0x20);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar25,0);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar25 >> 0x20);
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_d8);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_f8);
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_f8,
               (this->super_Trainer).model);
    pSVar8 = (this->v).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->v).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pSVar9 = (this->v).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_f8.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar9,0);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar9 >> 0x20);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar8,0);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar8 >> 0x20);
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_d8);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_f8);
    AllocateShadowLookupParameters(&local_f8,(this->super_Trainer).model);
    pSVar25 = (this->lv).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->lv).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar21 = (this->lv).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_f8.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           local_f8.
                           super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar21,0);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar21 >> 0x20);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar25,0);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar25 >> 0x20);
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_d8);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_f8);
    this->shadow_params_allocated = true;
  }
  fVar40 = Trainer::clip_gradients(&this->super_Trainer);
  pMVar23 = (this->super_Trainer).model;
  pSVar25 = *(pointer *)(pMVar23 + 0x18);
  local_78 = *(pointer *)(pMVar23 + 0x20);
  if (pSVar25 != local_78) {
    p_Var26 = (_Hash_node_base *)0x0;
    local_80 = (pointer)CONCAT44(local_80._4_4_,fVar40 * local_a0._0_4_);
    fVar52 = fVar40 * local_a0._0_4_;
    do {
      local_68._0_8_ = pSVar25;
      this_00 = *(Parameters **)
                 &(pSVar25->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl
      ;
      uVar22 = update::t + 1;
      uVar37 = (ulong)(this_00->g).d.nd;
      iVar24 = 1;
      iVar38 = 1;
      if (uVar37 != 0) {
        iVar38 = 1;
        uVar30 = 0;
        do {
          iVar38 = iVar38 * (this_00->g).d.d[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar37 != uVar30);
      }
      pSVar8 = (this->m).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar37 = (ulong)pSVar8[(long)p_Var26].h.d.nd;
      if (uVar37 != 0) {
        iVar24 = 1;
        uVar30 = 0;
        do {
          iVar24 = iVar24 * *(int *)((long)pSVar8[(long)p_Var26].h.d.d + uVar30 * 4);
          uVar30 = uVar30 + 1;
        } while (uVar37 != uVar30);
      }
      pSVar9 = (this->v).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar37 = (ulong)pSVar9[(long)p_Var26].h.d.nd;
      iVar28 = 1;
      iVar27 = 1;
      if (uVar37 != 0) {
        uVar30 = 0;
        do {
          iVar27 = iVar27 * *(int *)((long)pSVar9[(long)p_Var26].h.d.d + uVar30 * 4);
          uVar30 = uVar30 + 1;
        } while (uVar37 != uVar30);
      }
      uVar29 = pSVar9[(long)p_Var26].h.d.bd;
      uVar37 = (ulong)(this_00->values).d.nd;
      if (uVar37 != 0) {
        iVar28 = 1;
        uVar30 = 0;
        do {
          iVar28 = iVar28 * (this_00->values).d.d[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar37 != uVar30);
      }
      uVar39 = iVar38 * (this_00->g).d.bd;
      uVar37 = (ulong)uVar39;
      update::t = uVar22;
      local_70 = p_Var26;
      if (iVar24 * pSVar8[(long)p_Var26].h.d.bd != uVar39) goto LAB_00222b41;
      pfVar10 = (this_00->g).v;
      pfVar11 = pSVar8[(long)p_Var26].h.v;
      pfVar12 = pSVar9[(long)p_Var26].h.v;
      pfVar13 = (this_00->values).v;
      uVar7 = (this_00->values).d.bd;
      rVar6 = (this->super_Trainer).lambda;
      fVar41 = this->beta_1;
      local_d8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_d8.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar41);
      local_d8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(pfVar11,0);
      local_d8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)((ulong)pfVar11 >> 0x20)
      ;
      local_f8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_f8.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar52);
      local_f8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(pfVar10,0);
      local_f8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)((ulong)pfVar10 >> 0x20)
      ;
      uVar30 = uVar37;
      if ((((ulong)pfVar11 & 3) == 0) &&
         (uVar30 = (ulong)(-((uint)((ulong)pfVar11 >> 2) & 0x3fffffff) & 3), uVar37 <= uVar30)) {
        uVar30 = uVar37;
      }
      fVar42 = 1.0 - fVar41;
      uVar32 = uVar37 - uVar30;
      uVar31 = uVar32 + 3;
      if (-1 < (long)uVar32) {
        uVar31 = uVar32;
      }
      if (uVar30 != 0) {
        uVar35 = 0;
        do {
          pfVar11[uVar35] = pfVar10[uVar35] * fVar52 * fVar42 + pfVar11[uVar35] * fVar41;
          uVar35 = uVar35 + 1;
        } while (uVar30 != uVar35);
      }
      uVar31 = (uVar31 & 0xfffffffffffffffc) + uVar30;
      if (3 < (long)uVar32) {
        do {
          pfVar1 = pfVar11 + uVar30;
          fVar43 = pfVar1[1];
          fVar53 = pfVar1[2];
          fVar56 = pfVar1[3];
          pfVar4 = pfVar10 + uVar30;
          fVar57 = pfVar4[1];
          fVar58 = pfVar4[2];
          fVar61 = pfVar4[3];
          pfVar5 = pfVar11 + uVar30;
          *pfVar5 = *pfVar4 * fVar52 * fVar42 + *pfVar1 * fVar41;
          pfVar5[1] = fVar57 * fVar52 * fVar42 + fVar43 * fVar41;
          pfVar5[2] = fVar58 * fVar52 * fVar42 + fVar53 * fVar41;
          pfVar5[3] = fVar61 * fVar52 * fVar42 + fVar56 * fVar41;
          uVar30 = uVar30 + 4;
        } while ((long)uVar30 < (long)uVar31);
      }
      if ((long)uVar31 < (long)uVar37) {
        do {
          pfVar11[uVar31] = pfVar10[uVar31] * fVar52 * fVar42 + pfVar11[uVar31] * fVar41;
          uVar31 = uVar31 + 1;
        } while (uVar37 != uVar31);
      }
      if (iVar27 * uVar29 != uVar39) goto LAB_00222b2a;
      fVar41 = this->beta_2;
      local_d8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_d8.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar41);
      local_d8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(pfVar12,0);
      local_d8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)((ulong)pfVar12 >> 0x20)
      ;
      local_f8.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_f8.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar52);
      uVar30 = uVar37;
      if ((((ulong)pfVar12 & 3) == 0) &&
         (uVar30 = (ulong)(-((uint)((ulong)pfVar12 >> 2) & 0x3fffffff) & 3), uVar37 <= uVar30)) {
        uVar30 = uVar37;
      }
      fVar42 = 1.0 - fVar41;
      uVar32 = uVar37 - uVar30;
      uVar31 = uVar32 + 3;
      if (-1 < (long)uVar32) {
        uVar31 = uVar32;
      }
      if (uVar30 != 0) {
        uVar35 = 0;
        do {
          pfVar12[uVar35] =
               pfVar10[uVar35] * fVar52 * pfVar10[uVar35] * fVar52 * fVar42 +
               pfVar12[uVar35] * fVar41;
          uVar35 = uVar35 + 1;
        } while (uVar30 != uVar35);
      }
      uVar31 = (uVar31 & 0xfffffffffffffffc) + uVar30;
      if (3 < (long)uVar32) {
        do {
          pfVar4 = pfVar12 + uVar30;
          fVar43 = pfVar4[1];
          fVar53 = pfVar4[2];
          fVar56 = pfVar4[3];
          pfVar1 = pfVar10 + uVar30;
          fVar57 = pfVar1[1];
          fVar58 = pfVar1[2];
          fVar61 = pfVar1[3];
          pfVar5 = pfVar12 + uVar30;
          *pfVar5 = *pfVar1 * fVar52 * fVar52 * *pfVar1 * fVar42 + *pfVar4 * fVar41;
          pfVar5[1] = fVar57 * fVar52 * fVar52 * fVar57 * fVar42 + fVar43 * fVar41;
          pfVar5[2] = fVar58 * fVar52 * fVar52 * fVar58 * fVar42 + fVar53 * fVar41;
          pfVar5[3] = fVar61 * fVar52 * fVar52 * fVar61 * fVar42 + fVar56 * fVar41;
          uVar30 = uVar30 + 4;
        } while ((long)uVar30 < (long)uVar31);
      }
      _local_98 = ZEXT416((uint)rVar6);
      if ((long)uVar31 < (long)uVar37) {
        do {
          pfVar12[uVar31] =
               pfVar10[uVar31] * fVar52 * pfVar10[uVar31] * fVar52 * fVar42 +
               pfVar12[uVar31] * fVar41;
          uVar31 = uVar31 + 1;
        } while (uVar37 != uVar31);
      }
      local_58 = fVar52;
      pfStack_4c = pfVar10;
      local_b8 = pow((double)this->beta_1,(double)uVar22);
      dVar18 = pow((double)this->beta_2,(double)update::t);
      if (uVar39 != iVar28 * uVar7) goto LAB_00222b58;
      uVar37 = (ulong)(this_00->values).d.nd;
      iVar24 = 1;
      if (uVar37 != 0) {
        uVar30 = 0;
        do {
          iVar24 = iVar24 * (this_00->values).d.d[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar37 != uVar30);
      }
      uVar22 = iVar24 * (this_00->values).d.bd;
      uVar37 = (ulong)uVar22;
      if (uVar22 != uVar39) {
LAB_00222b0b:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      pfVar10 = (this_00->values).v;
      uVar30 = uVar37;
      if ((((ulong)pfVar10 & 3) == 0) &&
         (uVar30 = (ulong)(-((uint)((ulong)pfVar10 >> 2) & 0x3fffffff) & 3), uVar37 <= uVar30)) {
        uVar30 = uVar37;
      }
      fVar42 = (float)(1.0 - local_b8);
      fVar41 = (float)(1.0 - dVar18);
      fVar43 = -(this->super_Trainer).eta;
      fVar52 = this->eps;
      uVar32 = uVar37 - uVar30;
      uVar31 = uVar32 + 3;
      if (-1 < (long)uVar32) {
        uVar31 = uVar32;
      }
      if (uVar30 != 0) {
        uVar35 = 0;
        do {
          pfVar10[uVar35] =
               (((pfVar11[uVar35] / fVar42) * fVar43) / (SQRT(pfVar12[uVar35] / fVar41) + fVar52) -
               pfVar13[uVar35] * (float)local_98._0_4_) + pfVar10[uVar35];
          uVar35 = uVar35 + 1;
        } while (uVar30 != uVar35);
      }
      uVar31 = (uVar31 & 0xfffffffffffffffc) + uVar30;
      if (3 < (long)uVar32) {
        local_b8 = (double)CONCAT44(fVar43,fVar43);
        auVar55._4_4_ = fVar42;
        auVar55._0_4_ = fVar42;
        auVar55._8_4_ = fVar42;
        auVar55._12_4_ = fVar42;
        do {
          auVar54._4_4_ = fVar41;
          auVar54._0_4_ = fVar41;
          auVar54._8_4_ = fVar41;
          auVar54._12_4_ = fVar41;
          auVar54 = divps(*(undefined1 (*) [16])(pfVar12 + uVar30),auVar54);
          fVar53 = auVar54._0_4_;
          fVar56 = auVar54._4_4_;
          fVar57 = auVar54._8_4_;
          fVar58 = auVar54._12_4_;
          auVar44._0_4_ = -(uint)((int)fVar53 < 0);
          auVar44._4_4_ = -(uint)((int)fVar56 < 0);
          auVar44._8_4_ = -(uint)((int)fVar57 < 0);
          auVar44._12_4_ = -(uint)((int)fVar58 < 0);
          auVar62 = rsqrtps(in_XMM13,auVar54);
          fVar61 = auVar62._0_4_;
          fVar64 = auVar62._4_4_;
          fVar65 = auVar62._8_4_;
          fVar66 = auVar62._12_4_;
          auVar54 = auVar54 & _DAT_00226c60;
          iVar24 = auVar54._0_4_;
          iVar38 = auVar54._4_4_;
          iVar27 = auVar54._8_4_;
          iVar28 = auVar54._12_4_;
          auVar59._0_4_ = -(uint)(-0x7f800002 < (int)(iVar24 - 1U ^ 0x80000000));
          auVar59._4_4_ = -(uint)(-0x7f800002 < (int)(iVar38 - 1U ^ 0x80000000));
          auVar59._8_4_ = -(uint)(-0x7f800002 < (int)(iVar27 - 1U ^ 0x80000000));
          auVar59._12_4_ = -(uint)(-0x7f800002 < (int)(iVar28 - 1U ^ 0x80000000));
          auVar45._0_4_ = -(uint)(iVar24 == 0x7f800000);
          auVar45._4_4_ = -(uint)(iVar38 == 0x7f800000);
          auVar45._8_4_ = -(uint)(iVar27 == 0x7f800000);
          auVar45._12_4_ = -(uint)(iVar28 == 0x7f800000);
          in_XMM13._0_4_ = -(uint)(0x7f800000 < iVar24);
          in_XMM13._4_4_ = -(uint)(0x7f800000 < iVar38);
          in_XMM13._8_4_ = -(uint)(0x7f800000 < iVar27);
          in_XMM13._12_4_ = -(uint)(0x7f800000 < iVar28);
          in_XMM13 = in_XMM13 | auVar45;
          auVar46._0_4_ = -(uint)((int)(iVar24 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar46._4_4_ = -(uint)((int)(iVar38 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar46._8_4_ = -(uint)((int)(iVar27 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar46._12_4_ = -(uint)((int)(iVar28 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar54 = auVar46 | in_XMM13 | ~auVar59 & auVar44;
          auVar62 = divps(*(undefined1 (*) [16])(pfVar11 + uVar30),auVar55);
          auVar47._0_4_ = auVar62._0_4_ * fVar43;
          auVar47._4_4_ = auVar62._4_4_ * fVar43;
          auVar47._8_4_ = auVar62._8_4_ * fVar43;
          auVar47._12_4_ = auVar62._12_4_ * fVar43;
          auVar62._4_4_ =
               (float)((uint)((fVar64 * fVar64 * fVar56 * -0.5 + 1.5) * fVar64 * fVar56) &
                      auVar54._4_4_) + fVar52;
          auVar62._0_4_ =
               (float)((uint)((fVar61 * fVar61 * fVar53 * -0.5 + 1.5) * fVar61 * fVar53) &
                      auVar54._0_4_) + fVar52;
          auVar62._8_4_ =
               (float)((uint)((fVar65 * fVar65 * fVar57 * -0.5 + 1.5) * fVar65 * fVar57) &
                      auVar54._8_4_) + fVar52;
          auVar62._12_4_ =
               (float)((uint)((fVar66 * fVar66 * fVar58 * -0.5 + 1.5) * fVar66 * fVar58) &
                      auVar54._12_4_) + fVar52;
          auVar54 = divps(auVar47,auVar62);
          pfVar5 = pfVar13 + uVar30;
          fVar53 = pfVar5[1];
          fVar56 = pfVar5[2];
          fVar57 = pfVar5[3];
          pfVar4 = pfVar10 + uVar30;
          fVar58 = pfVar4[1];
          fVar61 = pfVar4[2];
          fVar64 = pfVar4[3];
          pfVar1 = pfVar10 + uVar30;
          *pfVar1 = (auVar54._0_4_ - *pfVar5 * (float)local_98._0_4_) + *pfVar4;
          pfVar1[1] = (auVar54._4_4_ - fVar53 * (float)local_98._0_4_) + fVar58;
          pfVar1[2] = (auVar54._8_4_ - fVar56 * (float)local_98._0_4_) + fVar61;
          pfVar1[3] = (auVar54._12_4_ - fVar57 * (float)local_98._0_4_) + fVar64;
          uVar30 = uVar30 + 4;
          fStack_b0 = fVar43;
          fStack_ac = fVar43;
        } while ((long)uVar30 < (long)uVar31);
      }
      if ((long)uVar31 < (long)uVar37) {
        do {
          pfVar10[uVar31] =
               (((pfVar11[uVar31] / fVar42) * fVar43) / (SQRT(pfVar12[uVar31] / fVar41) + fVar52) -
               pfVar13[uVar31] * (float)local_98._0_4_) + pfVar10[uVar31];
          uVar31 = uVar31 + 1;
        } while (uVar37 != uVar31);
      }
      Parameters::clear(this_00);
      p_Var26 = (_Hash_node_base *)(ulong)((int)local_70 + 1);
      pSVar25 = (pointer)(local_68._0_8_ + 8);
      fVar52 = local_80._0_4_;
    } while (pSVar25 != local_78);
    pMVar23 = (this->super_Trainer).model;
  }
  local_38 = *(long **)(pMVar23 + 0x30);
  local_40 = *(long **)(pMVar23 + 0x38);
  if (local_38 != local_40) {
    fVar40 = fVar40 * local_a0._0_4_;
    local_88 = 0;
    do {
      this_01 = (LookupParameters *)*local_38;
      p_Var26 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var26 != (_Hash_node_base *)0x0) {
        local_80 = (this->lm).
                   super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_88;
        local_78 = (this->lv).
                   super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_88;
        local_a0 = this_01;
        do {
          uVar37 = (ulong)*(uint *)&p_Var26[1]._M_nxt;
          lVar14 = *(long *)&(local_80->h).
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl;
          local_b8 = (double)(uVar37 * 9);
          lVar2 = lVar14 + uVar37 * 0x48;
          iVar24 = 1;
          iVar38 = 1;
          if ((ulong)*(uint *)(lVar2 + 0x1c) != 0) {
            uVar30 = 0;
            do {
              iVar38 = iVar38 * *(int *)(lVar2 + uVar30 * 4);
              uVar30 = uVar30 + 1;
            } while (*(uint *)(lVar2 + 0x1c) != uVar30);
          }
          lVar15 = *(long *)&(local_78->h).
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl;
          lVar3 = lVar15 + uVar37 * 0x48;
          if ((ulong)*(uint *)(lVar3 + 0x1c) != 0) {
            iVar24 = 1;
            uVar30 = 0;
            do {
              iVar24 = iVar24 * *(int *)(lVar3 + uVar30 * 4);
              uVar30 = uVar30 + 1;
            } while (*(uint *)(lVar3 + 0x1c) != uVar30);
          }
          pTVar16 = (local_a0->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar30 = (ulong)pTVar16[uVar37].d.nd;
          iVar28 = 1;
          iVar27 = 1;
          if (uVar30 != 0) {
            iVar27 = 1;
            uVar31 = 0;
            do {
              iVar27 = iVar27 * pTVar16[uVar37].d.d[uVar31];
              uVar31 = uVar31 + 1;
            } while (uVar30 != uVar31);
          }
          pTVar17 = (local_a0->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar30 = (ulong)pTVar17[uVar37].d.nd;
          if (uVar30 != 0) {
            iVar28 = 1;
            uVar31 = 0;
            do {
              iVar28 = iVar28 * pTVar17[uVar37].d.d[uVar31];
              uVar31 = uVar31 + 1;
            } while (uVar30 != uVar31);
          }
          uVar29 = iVar38 * *(int *)(lVar2 + 0x20);
          uVar22 = iVar27 * pTVar16[uVar37].d.bd;
          uVar30 = (ulong)uVar22;
          local_70 = p_Var26;
          if (uVar29 != uVar22) goto LAB_00222b41;
          uVar31 = *(ulong *)(lVar14 + 0x28 + uVar37 * 0x48);
          uVar32 = *(ulong *)(lVar15 + 0x28 + uVar37 * 0x48);
          iVar38 = *(int *)(lVar3 + 0x20);
          pfVar10 = pTVar16[uVar37].v;
          pfVar11 = pTVar17[uVar37].v;
          uVar22 = pTVar17[uVar37].d.bd;
          rVar6 = (this->super_Trainer).lambda;
          fVar52 = this->beta_1;
          local_d8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_d8.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar52);
          local_d8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)uVar31;
          local_d8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)(uVar31 >> 0x20);
          local_f8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_f8.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar40);
          local_f8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(pfVar10,0);
          local_f8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (undefined4)((ulong)pfVar10 >> 0x20);
          uVar37 = uVar30;
          if (((uVar31 & 3) == 0) &&
             (uVar37 = (ulong)(-((uint)(uVar31 >> 2) & 0x3fffffff) & 3), uVar30 <= uVar37)) {
            uVar37 = uVar30;
          }
          fVar41 = 1.0 - fVar52;
          uVar33 = uVar30 - uVar37;
          uVar35 = uVar33 + 3;
          if (-1 < (long)uVar33) {
            uVar35 = uVar33;
          }
          if (uVar37 != 0) {
            uVar36 = 0;
            do {
              *(float *)(uVar31 + uVar36 * 4) =
                   pfVar10[uVar36] * fVar40 * fVar41 + *(float *)(uVar31 + uVar36 * 4) * fVar52;
              uVar36 = uVar36 + 1;
            } while (uVar37 != uVar36);
          }
          uVar35 = (uVar35 & 0xfffffffffffffffc) + uVar37;
          if (3 < (long)uVar33) {
            do {
              pfVar12 = (float *)(uVar31 + uVar37 * 4);
              fVar42 = pfVar12[1];
              fVar43 = pfVar12[2];
              fVar53 = pfVar12[3];
              pfVar13 = pfVar10 + uVar37;
              fVar56 = pfVar13[1];
              fVar57 = pfVar13[2];
              fVar58 = pfVar13[3];
              pfVar4 = (float *)(uVar31 + uVar37 * 4);
              *pfVar4 = *pfVar13 * fVar40 * fVar41 + *pfVar12 * fVar52;
              pfVar4[1] = fVar56 * fVar40 * fVar41 + fVar42 * fVar52;
              pfVar4[2] = fVar57 * fVar40 * fVar41 + fVar43 * fVar52;
              pfVar4[3] = fVar58 * fVar40 * fVar41 + fVar53 * fVar52;
              uVar37 = uVar37 + 4;
            } while ((long)uVar37 < (long)uVar35);
          }
          if ((long)uVar35 < (long)uVar30) {
            do {
              *(float *)(uVar31 + uVar35 * 4) =
                   pfVar10[uVar35] * fVar40 * fVar41 + *(float *)(uVar31 + uVar35 * 4) * fVar52;
              uVar35 = uVar35 + 1;
            } while (uVar30 != uVar35);
          }
          if (iVar24 * iVar38 != uVar29) goto LAB_00222b2a;
          fVar52 = this->beta_2;
          local_d8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_d8.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar52);
          local_d8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)uVar32;
          local_d8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)(uVar32 >> 0x20);
          local_f8.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_f8.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar40);
          uVar37 = uVar30;
          if (((uVar32 & 3) == 0) &&
             (uVar37 = (ulong)(-((uint)(uVar32 >> 2) & 0x3fffffff) & 3), uVar30 <= uVar37)) {
            uVar37 = uVar30;
          }
          local_68 = ZEXT416((uint)rVar6);
          fVar41 = 1.0 - fVar52;
          uVar33 = uVar30 - uVar37;
          uVar35 = uVar33 + 3;
          if (-1 < (long)uVar33) {
            uVar35 = uVar33;
          }
          if (uVar37 != 0) {
            uVar36 = 0;
            do {
              *(float *)(uVar32 + uVar36 * 4) =
                   pfVar10[uVar36] * fVar40 * pfVar10[uVar36] * fVar40 * fVar41 +
                   *(float *)(uVar32 + uVar36 * 4) * fVar52;
              uVar36 = uVar36 + 1;
            } while (uVar37 != uVar36);
          }
          uVar35 = (uVar35 & 0xfffffffffffffffc) + uVar37;
          if (3 < (long)uVar33) {
            do {
              pfVar13 = (float *)(uVar32 + uVar37 * 4);
              fVar42 = pfVar13[1];
              fVar43 = pfVar13[2];
              fVar53 = pfVar13[3];
              pfVar12 = pfVar10 + uVar37;
              fVar56 = pfVar12[1];
              fVar57 = pfVar12[2];
              fVar58 = pfVar12[3];
              pfVar4 = (float *)(uVar32 + uVar37 * 4);
              *pfVar4 = *pfVar12 * fVar40 * fVar40 * *pfVar12 * fVar41 + *pfVar13 * fVar52;
              pfVar4[1] = fVar56 * fVar40 * fVar40 * fVar56 * fVar41 + fVar42 * fVar52;
              pfVar4[2] = fVar57 * fVar40 * fVar40 * fVar57 * fVar41 + fVar43 * fVar52;
              pfVar4[3] = fVar58 * fVar40 * fVar40 * fVar58 * fVar41 + fVar53 * fVar52;
              uVar37 = uVar37 + 4;
            } while ((long)uVar37 < (long)uVar35);
          }
          if ((long)uVar35 < (long)uVar30) {
            do {
              *(float *)(uVar32 + uVar35 * 4) =
                   pfVar10[uVar35] * fVar40 * pfVar10[uVar35] * fVar40 * fVar41 +
                   *(float *)(uVar32 + uVar35 * 4) * fVar52;
              uVar35 = uVar35 + 1;
            } while (uVar30 != uVar35);
          }
          local_58 = fVar40;
          pfStack_4c = pfVar10;
          dVar18 = pow((double)this->beta_1,(double)update::t);
          local_98 = (undefined1  [8])dVar18;
          dVar18 = pow((double)this->beta_2,(double)update::t);
          if (uVar29 != iVar28 * uVar22) goto LAB_00222b58;
          pTVar16 = (local_a0->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar37 = (ulong)(pTVar16->d).d[(long)local_b8 * 2U + 7];
          iVar24 = 1;
          if (uVar37 != 0) {
            uVar30 = 0;
            do {
              iVar24 = iVar24 * (pTVar16->d).d[(long)local_b8 * 2U + uVar30];
              uVar30 = uVar30 + 1;
            } while (uVar37 != uVar30);
          }
          uVar22 = iVar24 * (pTVar16->d).d[(long)local_b8 * 2U + 8];
          uVar37 = (ulong)uVar22;
          if (uVar22 != uVar29) goto LAB_00222b0b;
          uVar30 = *(ulong *)((long)(&pTVar16->d + 1) + (long)local_b8 * 8 + 4);
          uVar35 = uVar37;
          if (((uVar30 & 3) == 0) &&
             (uVar35 = (ulong)(-((uint)(uVar30 >> 2) & 0x3fffffff) & 3), uVar37 <= uVar35)) {
            uVar35 = uVar37;
          }
          fVar42 = (float)(1.0 - (double)local_98);
          fVar41 = (float)(1.0 - dVar18);
          fVar43 = -(this->super_Trainer).eta;
          fVar52 = this->eps;
          uVar36 = uVar37 - uVar35;
          uVar33 = uVar36 + 3;
          if (-1 < (long)uVar36) {
            uVar33 = uVar36;
          }
          if (uVar35 != 0) {
            uVar34 = 0;
            do {
              *(float *)(uVar30 + uVar34 * 4) =
                   (((*(float *)(uVar31 + uVar34 * 4) / fVar42) * fVar43) /
                    (SQRT(*(float *)(uVar32 + uVar34 * 4) / fVar41) + fVar52) -
                   pfVar11[uVar34] * (float)local_68._0_4_) + *(float *)(uVar30 + uVar34 * 4);
              uVar34 = uVar34 + 1;
            } while (uVar35 != uVar34);
          }
          uVar33 = (uVar33 & 0xfffffffffffffffc) + uVar35;
          if (3 < (long)uVar36) {
            local_b8 = (double)CONCAT44(fVar43,fVar43);
            local_98._4_4_ = fVar42;
            local_98._0_4_ = fVar42;
            fStack_90 = fVar42;
            fStack_8c = fVar42;
            do {
              auVar19._4_4_ = fVar41;
              auVar19._0_4_ = fVar41;
              auVar19._8_4_ = fVar41;
              auVar19._12_4_ = fVar41;
              auVar55 = divps(*(undefined1 (*) [16])(uVar32 + uVar35 * 4),auVar19);
              fVar53 = auVar55._0_4_;
              fVar56 = auVar55._4_4_;
              fVar57 = auVar55._8_4_;
              fVar58 = auVar55._12_4_;
              auVar48._0_4_ = -(uint)((int)fVar53 < 0);
              auVar48._4_4_ = -(uint)((int)fVar56 < 0);
              auVar48._8_4_ = -(uint)((int)fVar57 < 0);
              auVar48._12_4_ = -(uint)((int)fVar58 < 0);
              auVar54 = rsqrtps(in_XMM13,auVar55);
              fVar61 = auVar54._0_4_;
              fVar64 = auVar54._4_4_;
              fVar65 = auVar54._8_4_;
              fVar66 = auVar54._12_4_;
              auVar55 = auVar55 & _DAT_00226c60;
              iVar24 = auVar55._0_4_;
              iVar38 = auVar55._4_4_;
              iVar27 = auVar55._8_4_;
              iVar28 = auVar55._12_4_;
              auVar60._0_4_ = -(uint)(-0x7f800002 < (int)(iVar24 - 1U ^ 0x80000000));
              auVar60._4_4_ = -(uint)(-0x7f800002 < (int)(iVar38 - 1U ^ 0x80000000));
              auVar60._8_4_ = -(uint)(-0x7f800002 < (int)(iVar27 - 1U ^ 0x80000000));
              auVar60._12_4_ = -(uint)(-0x7f800002 < (int)(iVar28 - 1U ^ 0x80000000));
              auVar49._0_4_ = -(uint)(iVar24 == (int)DAT_0022af90);
              auVar49._4_4_ = -(uint)(iVar38 == DAT_0022af90._4_4_);
              auVar49._8_4_ = -(uint)(iVar27 == DAT_0022af90._8_4_);
              auVar49._12_4_ = -(uint)(iVar28 == DAT_0022af90._12_4_);
              auVar63._0_4_ = -(uint)((int)DAT_0022af90 < iVar24);
              auVar63._4_4_ = -(uint)(DAT_0022af90._4_4_ < iVar38);
              auVar63._8_4_ = -(uint)(DAT_0022af90._8_4_ < iVar27);
              auVar63._12_4_ = -(uint)(DAT_0022af90._12_4_ < iVar28);
              in_XMM13 = auVar63 | auVar49;
              auVar50._0_4_ = -(uint)((int)(iVar24 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar50._4_4_ = -(uint)((int)(iVar38 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar50._8_4_ = -(uint)((int)(iVar27 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar50._12_4_ = -(uint)((int)(iVar28 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar55 = auVar50 | in_XMM13 | ~auVar60 & auVar48;
              auVar54 = divps(*(undefined1 (*) [16])(uVar31 + uVar35 * 4),_local_98);
              auVar51._0_4_ = auVar54._0_4_ * fVar43;
              auVar51._4_4_ = auVar54._4_4_ * fVar43;
              auVar51._8_4_ = auVar54._8_4_ * fVar43;
              auVar51._12_4_ = auVar54._12_4_ * fVar43;
              auVar20._4_4_ =
                   (float)((uint)((fVar64 * fVar64 * fVar56 * -0.5 + 1.5) * fVar64 * fVar56) &
                          auVar55._4_4_) + fVar52;
              auVar20._0_4_ =
                   (float)((uint)((fVar61 * fVar61 * fVar53 * -0.5 + 1.5) * fVar61 * fVar53) &
                          auVar55._0_4_) + fVar52;
              auVar20._8_4_ =
                   (float)((uint)((fVar65 * fVar65 * fVar57 * -0.5 + 1.5) * fVar65 * fVar57) &
                          auVar55._8_4_) + fVar52;
              auVar20._12_4_ =
                   (float)((uint)((fVar66 * fVar66 * fVar58 * -0.5 + 1.5) * fVar66 * fVar58) &
                          auVar55._12_4_) + fVar52;
              auVar55 = divps(auVar51,auVar20);
              pfVar10 = pfVar11 + uVar35;
              fVar53 = pfVar10[1];
              fVar56 = pfVar10[2];
              fVar57 = pfVar10[3];
              pfVar12 = (float *)(uVar30 + uVar35 * 4);
              fVar58 = pfVar12[1];
              fVar61 = pfVar12[2];
              fVar64 = pfVar12[3];
              pfVar13 = (float *)(uVar30 + uVar35 * 4);
              *pfVar13 = (auVar55._0_4_ - *pfVar10 * (float)local_68._0_4_) + *pfVar12;
              pfVar13[1] = (auVar55._4_4_ - fVar53 * (float)local_68._0_4_) + fVar58;
              pfVar13[2] = (auVar55._8_4_ - fVar56 * (float)local_68._0_4_) + fVar61;
              pfVar13[3] = (auVar55._12_4_ - fVar57 * (float)local_68._0_4_) + fVar64;
              uVar35 = uVar35 + 4;
              fStack_b0 = fVar43;
              fStack_ac = fVar43;
            } while ((long)uVar35 < (long)uVar33);
          }
          if ((long)uVar33 < (long)uVar37) {
            do {
              *(float *)(uVar30 + uVar33 * 4) =
                   (((*(float *)(uVar31 + uVar33 * 4) / fVar42) * fVar43) /
                    (SQRT(*(float *)(uVar32 + uVar33 * 4) / fVar41) + fVar52) -
                   pfVar11[uVar33] * (float)local_68._0_4_) + *(float *)(uVar30 + uVar33 * 4);
              uVar33 = uVar33 + 1;
            } while (uVar37 != uVar33);
          }
          p_Var26 = local_70->_M_nxt;
          this_01 = local_a0;
        } while (p_Var26 != (_Hash_node_base *)0x0);
      }
      LookupParameters::clear(this_01);
      local_88 = (ulong)((int)local_88 + 1);
      local_38 = local_38 + 1;
    } while (local_38 != local_40);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_00222b41:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>]"
  ;
  goto LAB_00222b6d;
LAB_00222b2a:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>]"
  ;
  goto LAB_00222b6d;
LAB_00222b58:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, c..." /* TRUNCATED STRING LITERAL */
  ;
LAB_00222b6d:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void AdamTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    m = AllocateShadowParameters(*model);
    lm = AllocateShadowLookupParameters(*model);
    v = AllocateShadowParameters(*model);
    lv = AllocateShadowLookupParameters(*model);
    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  static unsigned t = 0;
  for (auto p : model->parameters_list()) {
    ++t;
    auto g_t = (scale * gscale) * p->g.vec();
    auto m_t = m[pi].h.vec();
    auto v_t = v[pi].h.vec();
    auto reg = p->values.vec() * lambda;
    m_t = beta_1 * m_t + (1 - beta_1) * g_t;
    auto g2 = g_t.cwiseProduct(g_t);
    v_t = beta_2 * v_t + (1 - beta_2) * g2;
    float s1 = 1 - pow(beta_1, t);
    float s2 = 1 - pow(beta_2, t);
    auto mhat = m_t / s1;
    auto vhat = v_t / s2;
    auto delta = (-eta * mhat).cwiseQuotient((vhat.array().sqrt() + eps).matrix());
    p->values.vec() += delta - reg;
    p->clear();
    pi++;
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vm = lm[pi].h;
    vector<Tensor>& vv = lv[pi].h;
    for (auto i : p->non_zero_grads) {
      auto m_t = vm[i].vec();
      auto v_t = vv[i].vec();
      auto g_t = scale * gscale * p->grads[i].vec();
      auto g2 = g_t.cwiseProduct(g_t);
      auto reg = p->values[i].vec() * lambda;
      m_t = beta_1 * m_t + (1 - beta_1) * g_t;
      v_t = beta_2 * v_t + (1 - beta_2) * g2;
      float s1 = 1 - pow(beta_1, t);
      float s2 = 1 - pow(beta_2, t);
      auto mhat = m_t / s1;
      auto vhat = v_t / s2;
      auto delta = (-eta * mhat).cwiseQuotient((vhat.array().sqrt() + eps).matrix());
      p->values[i].vec() += delta - reg;
    }
    p->clear();
    pi++;
  }
  ++updates;
}